

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O2

uint8_t __thiscall m6502::RTI(m6502 *this)

{
  byte bVar1;
  ssize_t sVar2;
  size_t in_RCX;
  
  bVar1 = this->stackPointer + 1;
  this->stackPointer = bVar1;
  sVar2 = read(this,bVar1 | 0x100,(void *)0x0,in_RCX);
  this->status = (byte)sVar2 & 0xcf;
  bVar1 = this->stackPointer + 1;
  this->stackPointer = bVar1;
  sVar2 = read(this,bVar1 | 0x100,(void *)0x0,in_RCX);
  this->pc = (ushort)sVar2 & 0xff;
  bVar1 = this->stackPointer + 1;
  this->stackPointer = bVar1;
  sVar2 = read(this,bVar1 | 0x100,(void *)0x0,in_RCX);
  this->pc = this->pc | (ushort)(((uint)sVar2 & 0xff) << 8);
  return '\0';
}

Assistant:

uint8_t RTI()
  {
    ++stackPointer;
    status = read(0x0100u + stackPointer);
    status &= ~B;
    status &= ~U;

    ++stackPointer;
    pc = read(0x0100 + stackPointer);
    ++stackPointer;
    pc |= (read(0x0100 + stackPointer) << 8);
    return 0;
  }